

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayStencil
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  CubeMapArrayDataStorage *pCVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  fillStencilData(this,test_index);
  pCVar1 = this->m_cube_map_array_data;
  (**(code **)(lVar4 + 0x1398))
            (0x9009,1,0x88f0,pCVar1[test_index].m_width,pCVar1[test_index].m_height,
             pCVar1[test_index].m_depth);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not create an immutable stencil texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x215);
  pCVar1 = this->m_cube_map_array_data;
  (**(code **)(lVar4 + 0x13c0))
            (0x9009,0,0,0,0,pCVar1[test_index].m_width,pCVar1[test_index].m_height,
             pCVar1[test_index].m_depth,0x84f9,0x84fa,pCVar1[test_index].m_data_array);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not fill allocated texture storage with texture data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x223);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayStencil(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	fillStencilData(test_index);

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY,					   /* target */
					1,											   /* levels */
					GL_DEPTH24_STENCIL8,						   /* internalformat */
					m_cube_map_array_data[test_index].getWidth(),  /* width */
					m_cube_map_array_data[test_index].getHeight(), /* height */
					m_cube_map_array_data[test_index].getDepth()); /* depth */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create an immutable stencil texture storage!");

	gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY,							/* target */
					 0,													/* level */
					 0,													/* xoffset */
					 0,													/* yoffset */
					 0,													/* zoffset */
					 m_cube_map_array_data[test_index].getWidth(),		/* width */
					 m_cube_map_array_data[test_index].getHeight(),		/* height */
					 m_cube_map_array_data[test_index].getDepth(),		/* depth */
					 GL_DEPTH_STENCIL,									/* format */
					 GL_UNSIGNED_INT_24_8,								/* type */
					 m_cube_map_array_data[test_index].getDataArray()); /* data */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not fill allocated texture storage with texture data!");
}